

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

FunctionEntryPointInfo * __thiscall
Js::FunctionBody::GetEntryPointFromNativeAddress(FunctionBody *this,DWORD_PTR codeAddress)

{
  anon_class_16_2_d39a3114 fn;
  FunctionEntryPointInfo *local_20;
  FunctionEntryPointInfo *entryPoint;
  DWORD_PTR codeAddress_local;
  FunctionBody *this_local;
  
  local_20 = (FunctionEntryPointInfo *)0x0;
  fn.codeAddress = (DWORD_PTR *)&entryPoint;
  fn.entryPoint = &local_20;
  entryPoint = (FunctionEntryPointInfo *)codeAddress;
  codeAddress_local = (DWORD_PTR)this;
  MapEntryPoints<Js::FunctionBody::GetEntryPointFromNativeAddress(unsigned_long)::__0>(this,fn);
  return local_20;
}

Assistant:

FunctionEntryPointInfo * FunctionBody::GetEntryPointFromNativeAddress(DWORD_PTR codeAddress)
    {
        FunctionEntryPointInfo * entryPoint = nullptr;
        this->MapEntryPoints([&entryPoint, &codeAddress](int index, FunctionEntryPointInfo * currentEntryPoint)
        {
            // We need to do a second check for IsNativeCode because the entry point could be in the process of
            // being recorded on the background thread
            if (currentEntryPoint->IsInNativeAddressRange(codeAddress))
            {
                entryPoint = currentEntryPoint;
            }
        });

        return entryPoint;
    }